

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O0

int __thiscall
ncnn::Dequantize::forward(Dequantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  bool bVar2;
  float *pfVar3;
  int *piVar4;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float fVar5;
  int i_9;
  float bias_3;
  float scale_4;
  float *ptr_4;
  int *intptr_4;
  int q_1;
  int i_8;
  float scale_3;
  float *ptr_3;
  int *intptr_3;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_1;
  float bias_2;
  float scale_2;
  float *ptr_2;
  int *intptr_2;
  int i_7;
  int j;
  float scale_1;
  float *ptr_1;
  int *intptr_1;
  int i_6;
  int h;
  int w_1;
  int i_5;
  int i_4;
  float bias_1;
  int i_3;
  int i_2;
  int i_1;
  float bias;
  int i;
  float scale;
  float *ptr;
  int *intptr;
  int w;
  int dims;
  float local_2a8;
  float local_2a4;
  Mat *in_stack_fffffffffffffd60;
  Mat *pMVar6;
  Allocator *in_stack_fffffffffffffd68;
  size_t in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  float in_stack_fffffffffffffd84;
  Mat *in_stack_fffffffffffffd88;
  float local_258;
  float local_254;
  float local_250;
  int local_22c;
  Mat local_220;
  float *local_1d8;
  Mat local_1d0;
  int *local_188;
  int local_17c;
  int local_178;
  float local_174;
  Mat local_170;
  float *local_128;
  Mat local_110;
  int *local_c8;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  float local_a8;
  float local_a4;
  float *local_a0;
  int *local_98;
  int local_8c;
  int local_88;
  float local_84;
  float *local_80;
  int *local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  float local_5c;
  int local_58;
  int local_54;
  int local_50;
  float local_4c;
  int local_48;
  float local_44;
  float *local_40;
  int *local_38;
  int local_30;
  int local_2c;
  Mat *local_20;
  Mat *local_18;
  
  local_2c = in_RSI->dims;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (local_2c == 1) {
    local_30 = in_RSI->w;
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                      (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),in_stack_fffffffffffffd70,
                      in_stack_fffffffffffffd68);
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffd60);
    if (bVar2) {
      return -100;
    }
    local_38 = ncnn::Mat::operator_cast_to_int_(local_18);
    local_40 = ncnn::Mat::operator_cast_to_float_(local_20);
    if (*(int *)(in_RDI + 0xd0) == 1) {
      pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),0);
      local_44 = *pfVar3;
      if (*(int *)(in_RDI + 0xd4) == 0) {
        for (local_48 = 0; local_48 < local_30; local_48 = local_48 + 1) {
          local_40[local_48] = (float)local_38[local_48] * local_44;
        }
      }
      else if (*(int *)(in_RDI + 0xd4) == 1) {
        pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),0);
        local_4c = *pfVar3;
        for (local_50 = 0; local_50 < local_30; local_50 = local_50 + 1) {
          local_40[local_50] = (float)local_38[local_50] * local_44 + local_4c;
        }
      }
      else {
        for (local_54 = 0; local_54 < local_30; local_54 = local_54 + 1) {
          fVar5 = (float)local_38[local_54] * local_44;
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),(long)local_54);
          local_40[local_54] = fVar5 + *pfVar3;
        }
      }
    }
    else if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_58 = 0; local_58 < local_30; local_58 = local_58 + 1) {
        iVar1 = local_38[local_58];
        pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),(long)local_58);
        local_40[local_58] = (float)iVar1 * *pfVar3;
      }
    }
    else if (*(int *)(in_RDI + 0xd4) == 1) {
      pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),0);
      local_5c = *pfVar3;
      for (local_60 = 0; local_60 < local_30; local_60 = local_60 + 1) {
        iVar1 = local_38[local_60];
        pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),(long)local_60);
        local_40[local_60] = (float)iVar1 * *pfVar3 + local_5c;
      }
    }
    else {
      for (local_64 = 0; local_64 < local_30; local_64 = local_64 + 1) {
        iVar1 = local_38[local_64];
        pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),(long)local_64);
        fVar5 = *pfVar3;
        pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),(long)local_64);
        local_40[local_64] = (float)iVar1 * fVar5 + *pfVar3;
      }
    }
  }
  if (local_2c == 2) {
    local_68 = local_18->w;
    local_6c = local_18->h;
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                      (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78
                      ,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffd60);
    if (bVar2) {
      return -100;
    }
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_70 = 0; local_70 < local_6c; local_70 = local_70 + 1) {
        local_78 = ncnn::Mat::row<int_const>(local_18,local_70);
        local_80 = ncnn::Mat::row(local_20,local_70);
        if (*(int *)(in_RDI + 0xd0) == 1) {
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),0);
          local_250 = *pfVar3;
        }
        else {
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),(long)local_70);
          local_250 = *pfVar3;
        }
        local_84 = local_250;
        for (local_88 = 0; local_88 < local_68; local_88 = local_88 + 1) {
          local_80[local_88] = (float)local_78[local_88] * local_250;
        }
      }
    }
    else {
      for (local_8c = 0; local_8c < local_6c; local_8c = local_8c + 1) {
        local_98 = ncnn::Mat::row<int_const>(local_18,local_8c);
        local_a0 = ncnn::Mat::row(local_20,local_8c);
        if (*(int *)(in_RDI + 0xd0) == 1) {
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),0);
          local_254 = *pfVar3;
        }
        else {
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),(long)local_8c);
          local_254 = *pfVar3;
        }
        local_a4 = local_254;
        if (*(int *)(in_RDI + 0xd4) == 1) {
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),0);
          local_258 = *pfVar3;
        }
        else {
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),(long)local_8c);
          local_258 = *pfVar3;
        }
        local_a8 = local_258;
        for (local_ac = 0; local_ac < local_68; local_ac = local_ac + 1) {
          local_a0[local_ac] = (float)local_98[local_ac] * local_a4 + local_258;
        }
      }
    }
  }
  if (local_2c == 3) {
    local_b0 = local_18->w;
    local_b4 = local_18->h;
    local_b8 = local_18->c;
    local_bc = local_b0 * local_b4;
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                      (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),(int)in_stack_fffffffffffffd78
                      ,(int)(in_stack_fffffffffffffd70 >> 0x20),(size_t)in_stack_fffffffffffffd68,
                      (Allocator *)in_stack_fffffffffffffd60);
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffd60);
    if (bVar2) {
      return -100;
    }
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_c0 = 0; local_c0 < local_b8; local_c0 = local_c0 + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffffd88,(int)in_stack_fffffffffffffd84);
        piVar4 = ncnn::Mat::operator_cast_to_int_(&local_110);
        ncnn::Mat::~Mat((Mat *)0x6dbeff);
        in_stack_fffffffffffffd88 = &local_170;
        local_c8 = piVar4;
        ncnn::Mat::channel(in_stack_fffffffffffffd88,(int)in_stack_fffffffffffffd84);
        pfVar3 = ncnn::Mat::operator_cast_to_float_(in_stack_fffffffffffffd88);
        ncnn::Mat::~Mat((Mat *)0x6dbf4b);
        local_128 = pfVar3;
        if (*(int *)(in_RDI + 0xd0) == 1) {
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),0);
          in_stack_fffffffffffffd84 = *pfVar3;
        }
        else {
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),(long)local_c0);
          in_stack_fffffffffffffd84 = *pfVar3;
        }
        for (local_178 = 0; local_178 < local_bc; local_178 = local_178 + 1) {
          local_128[local_178] = (float)local_c8[local_178] * in_stack_fffffffffffffd84;
        }
        local_174 = in_stack_fffffffffffffd84;
      }
    }
    else {
      for (local_17c = 0; local_17c < local_b8; local_17c = local_17c + 1) {
        pMVar6 = &local_1d0;
        ncnn::Mat::channel(in_stack_fffffffffffffd88,(int)in_stack_fffffffffffffd84);
        piVar4 = ncnn::Mat::operator_cast_to_int_(pMVar6);
        ncnn::Mat::~Mat((Mat *)0x6dc0e5);
        pMVar6 = &local_220;
        local_188 = piVar4;
        ncnn::Mat::channel(in_stack_fffffffffffffd88,(int)in_stack_fffffffffffffd84);
        pfVar3 = ncnn::Mat::operator_cast_to_float_(pMVar6);
        ncnn::Mat::~Mat((Mat *)0x6dc131);
        local_1d8 = pfVar3;
        if (*(int *)(in_RDI + 0xd0) == 1) {
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),0);
          local_2a4 = *pfVar3;
        }
        else {
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd8),(long)local_17c);
          local_2a4 = *pfVar3;
        }
        if (*(int *)(in_RDI + 0xd4) == 1) {
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),0);
          local_2a8 = *pfVar3;
        }
        else {
          pfVar3 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),(long)local_17c);
          local_2a8 = *pfVar3;
        }
        for (local_22c = 0; local_22c < local_bc; local_22c = local_22c + 1) {
          local_1d8[local_22c] = (float)local_188[local_22c] * local_2a4 + local_2a8;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Dequantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int* intptr = bottom_blob;
        float* ptr = top_blob;

        if (scale_data_size == 1)
        {
            const float scale = scale_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias_data[i];
                }
            }
        }
        else
        {
            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i];
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i] + bias;
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i] + bias_data[i];
                }
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                float* ptr = top_blob.row(i);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = intptr[j] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                float* ptr = top_blob.row(i);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = intptr[j] * scale + bias;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                float* ptr = top_blob.channel(q);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                float* ptr = top_blob.channel(q);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
    }

    return 0;
}